

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

stumpless_target * stumpless_open_sqlite3_target_from_db(void *db)

{
  stumpless_target *target;
  sqlite3_target *psVar1;
  
  if (db == (void *)0x0) {
    raise_argument_empty("db was NULL");
  }
  else {
    target = new_target(STUMPLESS_SQLITE3_TARGET,"");
    if (target != (stumpless_target *)0x0) {
      psVar1 = new_sqlite3_target((sqlite3 *)db);
      target->id = psVar1;
      if (psVar1 != (sqlite3_target *)0x0) {
        stumpless_set_current_target(target);
        return target;
      }
      destroy_target(target);
    }
  }
  return (stumpless_target *)0x0;
}

Assistant:

struct stumpless_target *
stumpless_open_sqlite3_target_from_db( void *db ) {
  struct stumpless_target *target;

  VALIDATE_ARG_NOT_NULL( db );

  target = new_target( STUMPLESS_SQLITE3_TARGET, "" );

  if( !target ) {
    goto fail;
  }

  target->id = new_sqlite3_target( db );
  if( !target->id ) {
    goto fail_id;
  }

  stumpless_set_current_target( target );
  return target;

fail_id:
  destroy_target( target );
fail:
  return NULL;
}